

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> * __thiscall
tinyusdz::ascii::AsciiParser::ParsePrimMeta
          (optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
           *__return_storage_ptr__,AsciiParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  const_iterator cVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar5;
  _Alloc_hider _Var6;
  ListEditQual qual;
  string varname;
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pv;
  StringData sdata;
  MetaVariable var;
  ostringstream ss_e;
  ListEditQual local_2fc;
  string local_2f8;
  string local_2d8;
  undefined7 uStack_2d7;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0 [4];
  VariableDef local_268;
  storage_union local_200;
  vtable_type *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  undefined8 local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [24];
  string local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  ios_base local_158 [264];
  string local_50;
  
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar2) {
LAB_00330ab3:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    return __return_storage_ptr__;
  }
  local_2fc = ResetToExplicit;
  paVar1 = &local_268.type.field_2;
  local_268.type._M_string_length = 0;
  local_268.type.field_2._M_local_buf[0] = '\0';
  local_268.name._M_dataplus._M_p._0_2_ = 0;
  local_268.name._4_8_ = 0;
  local_268.type._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = MaybeTripleQuotedString(this,(StringData *)&local_268);
  if ((bVar2) || (bVar2 = MaybeString(this,(StringData *)&local_268), bVar2)) {
    local_2d0._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    _local_2d8 = (undefined1 *)0x0;
    local_2c0._8_8_ = 0;
    local_2b0[0]._M_local_buf[0] = '\0';
    local_2c0._M_allocated_capacity = (size_type)local_2b0;
    local_1c8 = (undefined1  [8])(local_1c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"comment","");
    linb::any::operator=((any *)&local_2d8,(StringData *)&local_268);
    ::std::__cxx11::string::_M_assign((string *)local_2c0._M_local_buf);
    if (local_1c8 != (undefined1  [8])(local_1c0 + 8)) {
      operator_delete((void *)local_1c8,local_1c0._8_8_ + 1);
    }
    local_1c8._0_4_ = local_2fc;
    local_1c0._16_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_1a8[8] = (string)0x0;
    local_1a8[9] = (string)0x0;
    local_1a8[10] = (string)0x0;
    local_1a8[0xb] = (string)0x0;
    local_1a8[0xc] = (string)0x0;
    local_1a8[0xd] = (string)0x0;
    local_1a8[0xe] = (string)0x0;
    local_1a8[0xf] = (string)0x0;
    local_198[0]._M_local_buf[0] = '\0';
    local_1a8._0_8_ = local_198;
    ::std::__cxx11::string::_M_assign(local_1a8);
    linb::any::operator=((any *)local_1c0,(any *)&local_2d8);
    __return_storage_ptr__->has_value_ = true;
    ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::pair
              ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
               &__return_storage_ptr__->contained,
               (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((vtable_type *)local_1c0._16_8_ != (vtable_type *)0x0) {
      (**(_func_void_storage_union_ptr **)(local_1c0._16_8_ + 0x20))((storage_union *)local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_allocated_capacity != local_2b0) {
      operator_delete((void *)local_2c0._M_allocated_capacity,
                      CONCAT71(local_2b0[0]._M_allocated_capacity._1_7_,local_2b0[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((vtable_type *)local_2d0._8_8_ != (vtable_type *)0x0) {
      (**(_func_void_storage_union_ptr **)(local_2d0._8_8_ + 0x20))((storage_union *)&local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.type._M_dataplus._M_p == &local_268.type.field_2) {
      return __return_storage_ptr__;
    }
    lVar5 = CONCAT71(local_268.type.field_2._M_allocated_capacity._1_7_,
                     local_268.type.field_2._M_local_buf[0]);
    _Var6._M_p = local_268.type._M_dataplus._M_p;
    goto LAB_003308fa;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.type._M_dataplus._M_p != paVar1) {
    operator_delete(local_268.type._M_dataplus._M_p,
                    CONCAT71(local_268.type.field_2._M_allocated_capacity._1_7_,
                             local_268.type.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = MaybeListEditQual(this,&local_2fc);
  if ((!bVar2) || (bVar2 = SkipWhitespaceAndNewline(this,true), !bVar2)) goto LAB_00330ab3;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  bVar2 = ReadIdentifier(this,&local_2f8);
  if (bVar2) {
    cVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
            ::find(&(this->_supported_prim_metas)._M_t,&local_2f8);
    bVar2 = Expect(this,'=');
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ParsePrimMeta",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0xc35);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"\'=\' expected in Prim Metadata line.",0x23);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_2d8);
      if ((undefined1 *)_local_2d8 != local_2d0 + 8) {
        operator_delete((void *)_local_2d8,(ulong)(local_2d0._8_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base(local_158);
      goto LAB_00330bf6;
    }
    SkipWhitespace(this);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header) {
      local_268.type._M_string_length = 0;
      local_268.type.field_2._M_local_buf[0] = '\0';
      local_268.type._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = ReadUntilNewline(this,&local_268.type);
      if (bVar2) {
        local_2d0._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
        _local_2d8 = (undefined1 *)0x0;
        local_2c0._M_allocated_capacity = (size_type)local_2b0;
        local_2c0._8_8_ = 0;
        local_2b0[0]._M_local_buf[0] = '\0';
        linb::any::operator=((any *)&local_2d8,&local_268.type);
        ::std::__cxx11::string::_M_assign((string *)local_2c0._M_local_buf);
        ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                  ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8,&local_2fc,
                   (MetaVariable *)&local_2d8);
        __return_storage_ptr__->has_value_ = true;
        ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::pair
                  ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
                   &__return_storage_ptr__->contained,
                   (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8);
        ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair
                  ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8);
        MetaVariable::~MetaVariable((MetaVariable *)&local_2d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"ParsePrimMeta",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0xc3f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"Failed to parse unregistered Prim metadata.",0x2b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_2d8);
        if ((undefined1 *)_local_2d8 != local_2d0 + 8) {
          operator_delete((void *)_local_2d8,(ulong)(local_2d0._8_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        ::std::ios_base::~ios_base(local_158);
        __return_storage_ptr__->has_value_ = false;
        *(undefined8 *)&__return_storage_ptr__->contained = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268.type._M_dataplus._M_p != paVar1) {
        operator_delete(local_268.type._M_dataplus._M_p,
                        CONCAT71(local_268.type.field_2._M_allocated_capacity._1_7_,
                                 local_268.type.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      GetPrimMetaDefinition
                ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_1c8,this,&local_2f8);
      local_2d8 = local_1c8[0];
      if (local_1c8[0] == (string)0x1) {
        VariableDef::VariableDef((VariableDef *)local_2d0,(VariableDef *)local_1c0);
      }
      if (((byte)local_1c8[0] & 1) != 0) {
        nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
        destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)local_1c0);
      }
      if (local_2d8 == (string)0x1) {
        local_1e8 = &local_1d8;
        local_1f0 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_200.dynamic = (vtable_type **)0x0;
        local_1e0 = 0;
        local_1d8._M_local_buf[0] = '\0';
        VariableDef::VariableDef(&local_268,(VariableDef *)local_2d0);
        bVar2 = ParseMetaValue(this,&local_268,(MetaVariable *)&local_200);
        if (bVar2) {
          ::std::__cxx11::string::_M_assign((string *)&local_1e8);
          ::std::make_pair<tinyusdz::ListEditQual&,tinyusdz::MetaVariable&>
                    ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8,&local_2fc,
                     (MetaVariable *)&local_200);
          __return_storage_ptr__->has_value_ = true;
          ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::pair
                    ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)
                     &__return_storage_ptr__->contained,
                     (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8);
          ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair
                    ((pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)local_1c8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"ParsePrimMeta",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0xc4c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"Failed to parse Prim meta value.",0x20);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          ::std::ios_base::~ios_base(local_158);
          __return_storage_ptr__->has_value_ = false;
          *(undefined8 *)&__return_storage_ptr__->contained = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
        }
        VariableDef::~VariableDef(&local_268);
        MetaVariable::~MetaVariable((MetaVariable *)&local_200);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"ParsePrimMeta",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0xc55);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_200.dynamic = &local_1f0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,
                   "[Internal error] Unsupported/unimplemented PrimSpec metadata {}","");
        fmt::format<std::__cxx11::string>
                  ((string *)&local_268,(fmt *)&local_200,(string *)&local_2f8,in_RCX);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,local_268.type._M_dataplus._M_p,
                            local_268.type._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        paVar1 = &local_268.type.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268.type._M_dataplus._M_p != paVar1) {
          operator_delete(local_268.type._M_dataplus._M_p,
                          CONCAT71(local_268.type.field_2._M_allocated_capacity._1_7_,
                                   local_268.type.field_2._M_local_buf[0]) + 1);
        }
        if ((vtable_type **)local_200.dynamic != &local_1f0) {
          operator_delete(local_200.dynamic,(ulong)((long)&local_1f0->type_id + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_268.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268.type._M_dataplus._M_p != paVar1) {
          operator_delete(local_268.type._M_dataplus._M_p,
                          CONCAT71(local_268.type.field_2._M_allocated_capacity._1_7_,
                                   local_268.type.field_2._M_local_buf[0]) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        ::std::ios_base::~ios_base(local_158);
        __return_storage_ptr__->has_value_ = false;
        *(undefined8 *)&__return_storage_ptr__->contained = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
      }
      if (local_2d8 == (string)0x1) {
        nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
        destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *)local_2d0);
      }
    }
  }
  else {
LAB_00330bf6:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) {
    return __return_storage_ptr__;
  }
  lVar5 = CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,local_2f8.field_2._M_local_buf[0]);
  _Var6._M_p = local_2f8._M_dataplus._M_p;
LAB_003308fa:
  operator_delete(_Var6._M_p,lVar5 + 1);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::pair<ListEditQual, MetaVariable>>
AsciiParser::ParsePrimMeta() {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};

  // May be string only(varname is "comment")
  // For some reason, string-only data is just stored in `MetaVariable` and
  // reconstructed in ReconstructPrimMeta in usda-reader.cc later
  //
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      MetaVariable var;
      // empty name
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);

    } else if (MaybeString(&sdata)) {
      MetaVariable var;
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);
    }
  }

  if (!MaybeListEditQual(&qual)) {
    return nonstd::nullopt;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return nonstd::nullopt;
  }

  DCOUT("Identifier = " << varname);

  bool registered_meta = IsRegisteredPrimMeta(varname);

  if (!Expect('=')) {
    PUSH_ERROR("'=' expected in Prim Metadata line.");
    return nonstd::nullopt;
  }
  SkipWhitespace();

  if (!registered_meta) {
    // parse as string until newline

    std::string content;
    if (!ReadUntilNewline(&content)) {
      PUSH_ERROR("Failed to parse unregistered Prim metadata.");
      return nonstd::nullopt;
    }

    MetaVariable var;
    var.set_value(varname, content);

    return std::make_pair(qual, var);
  } else {
    if (auto pv = GetPrimMetaDefinition(varname)) {
      MetaVariable var;
      const auto vardef = pv.value();
      if (!ParseMetaValue(vardef, &var)) {
        PUSH_ERROR("Failed to parse Prim meta value.");
        return nonstd::nullopt;
      }
      var.set_name(varname);

      return std::make_pair(qual, var);
    } else {
      PUSH_ERROR(fmt::format(
          "[Internal error] Unsupported/unimplemented PrimSpec metadata {}",
          varname));
      return nonstd::nullopt;
    }
  }
}